

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

Container * __thiscall
scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
construct<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Container *__return_storage_ptr__,
          VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end)

{
  bool bVar1;
  reference puVar2;
  Node local_70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> i;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  Container *nodes;
  
  i._M_current._7_1_ = 0;
  local_20._M_current = begin._M_current;
  end_local._M_current = (unsigned_long *)this;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  ::vector(__return_storage_ptr__);
  local_30._M_current = end_local._M_current;
  while (bVar1 = __gnu_cxx::operator!=(&local_30,&local_20), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_30);
    Graph<unsigned_long,_scc::VectorType>::Node::Node(&local_70,*puVar2);
    std::
    vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
    ::push_back(__return_storage_ptr__,&local_70);
    Graph<unsigned_long,_scc::VectorType>::Node::~Node(&local_70);
    local_30 = std::
               next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (local_30,1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Container construct(Iter begin, Iter end) {
            Container nodes{};
            for (auto i = begin; i != end; i = std::next(i)) {
                nodes.push_back(N{*i});
            }
            return nodes;
        }